

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeSignature(ucvector *out)

{
  ucvector *out_local;
  
  ucvector_push_back(out,0x89);
  ucvector_push_back(out,'P');
  ucvector_push_back(out,'N');
  ucvector_push_back(out,'G');
  ucvector_push_back(out,'\r');
  ucvector_push_back(out,'\n');
  ucvector_push_back(out,'\x1a');
  ucvector_push_back(out,'\n');
  return;
}

Assistant:

static void writeSignature(ucvector* out)
{
  /*8 bytes PNG signature, aka the magic bytes*/
  ucvector_push_back(out, 137);
  ucvector_push_back(out, 80);
  ucvector_push_back(out, 78);
  ucvector_push_back(out, 71);
  ucvector_push_back(out, 13);
  ucvector_push_back(out, 10);
  ucvector_push_back(out, 26);
  ucvector_push_back(out, 10);
}